

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac_prng.c
# Opt level: O2

int tc_hmac_prng_reseed(TCHmacPrng_t prng,uint8_t *seed,uint seedlen,uint8_t *additional_input,
                       uint additionallen)

{
  int iVar1;
  
  iVar1 = 0;
  if (0x1f < seedlen && (seed != (uint8_t *)0x0 && prng != (TCHmacPrng_t)0x0)) {
    if (additional_input != (uint8_t *)0x0) {
      if (additionallen == 0) {
        return 0;
      }
      update(prng,seed,seedlen);
      seed = additional_input;
      seedlen = additionallen;
    }
    update(prng,seed,seedlen);
    prng->countdown = 0xffffffff;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int tc_hmac_prng_reseed(TCHmacPrng_t prng,
			const uint8_t *seed,
			unsigned int seedlen,
			const uint8_t *additional_input,
			unsigned int additionallen)
{

	/* input sanity check: */
	if (prng == (TCHmacPrng_t) 0 ||
	    seed == (const uint8_t *) 0 ||
	    seedlen < MIN_SLEN ||
	    seedlen > MAX_SLEN) {
		return TC_CRYPTO_FAIL;
	}

	if (additional_input != (const uint8_t *) 0) {
		/*
		 * Abort if additional_input is provided but has inappropriate
		 * length
		 */
		if (additionallen == 0 ||
		    additionallen > MAX_ALEN) {
			return TC_CRYPTO_FAIL;
		} else {
		/* call update for the seed and additional_input */
		update(prng, seed, seedlen);
		update(prng, additional_input, additionallen);
		}
	} else {
		/* call update only for the seed */
		update(prng, seed, seedlen);
	}

	/* ... and enable hmac_prng_generate */
	prng->countdown = MAX_GENS;

	return TC_CRYPTO_SUCCESS;
}